

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int BrotliDecoderSetParameter
              (BrotliDecoderStateInternal *state,BrotliDecoderParameter p,uint32_t value)

{
  uint32_t value_local;
  BrotliDecoderParameter p_local;
  BrotliDecoderStateInternal *state_local;
  
  if (state->state == BROTLI_STATE_UNINITED) {
    if (p == BROTLI_DECODER_PARAM_DISABLE_RING_BUFFER_REALLOCATION) {
      *(ushort *)&state->field_0x338 =
           *(ushort *)&state->field_0x338 & 0xffef | (ushort)(value == 0) << 4;
      state_local._4_4_ = 1;
    }
    else if (p == BROTLI_DECODER_PARAM_LARGE_WINDOW) {
      *(ushort *)&state->field_0x338 =
           *(ushort *)&state->field_0x338 & 0xffdf | (ushort)(value != 0) << 5;
      state_local._4_4_ = 1;
    }
    else if (p == BROTLI_DECODER_PARAM_SAVE_INFO) {
      *(ushort *)&state->field_0x338 =
           *(ushort *)&state->field_0x338 & 0xffbf | (ushort)(value != 0) << 6;
      state_local._4_4_ = 1;
    }
    else {
      state_local._4_4_ = 0;
    }
  }
  else {
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

BROTLI_BOOL BrotliDecoderSetParameter(
    BrotliDecoderState* state, BrotliDecoderParameter p, uint32_t value) {
  if (state->state != BROTLI_STATE_UNINITED) return BROTLI_FALSE;
  switch (p) {
    case BROTLI_DECODER_PARAM_DISABLE_RING_BUFFER_REALLOCATION:
      state->canny_ringbuffer_allocation = !!value ? 0 : 1;
      return BROTLI_TRUE;

    case BROTLI_DECODER_PARAM_LARGE_WINDOW:
      state->large_window = TO_BROTLI_BOOL(!!value);
      return BROTLI_TRUE;

    case BROTLI_DECODER_PARAM_SAVE_INFO:
     state->save_info_for_recompression = TO_BROTLI_BOOL(!!value);
     return BROTLI_TRUE;

    default: return BROTLI_FALSE;
  }
}